

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cc
# Opt level: O1

bool google::protobuf::io::Tokenizer::IsIdentifier(string *text)

{
  byte bVar1;
  long lVar2;
  string *__range3;
  bool bVar3;
  byte *local_28;
  long local_20;
  long local_18 [2];
  
  if ((text->_M_string_length == 0) ||
     ((bVar1 = *(text->_M_dataplus)._M_p, bVar1 != 0x5f && (0x19 < (byte)((bVar1 & 0xdf) + 0xbf)))))
  {
    bVar3 = false;
  }
  else {
    std::__cxx11::string::substr((ulong)&local_28,(ulong)text);
    bVar3 = local_20 == 0;
    if ((!bVar3) &&
       (((bVar1 = *local_28, bVar1 == 0x5f || ((byte)(bVar1 - 0x30) < 10)) ||
        ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a)))) {
      lVar2 = 1;
      do {
        bVar3 = local_20 == lVar2;
        if (bVar3) break;
        bVar1 = local_28[lVar2];
        lVar2 = lVar2 + 1;
      } while (((bVar1 == 0x5f) || ((byte)(bVar1 - 0x30) < 10)) ||
              ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a));
    }
    if (local_28 != (byte *)local_18) {
      operator_delete(local_28,local_18[0] + 1);
    }
  }
  return bVar3;
}

Assistant:

bool Tokenizer::IsIdentifier(const std::string& text) {
  // Mirrors IDENTIFIER definition in Tokenizer::Next() above.
  if (text.size() == 0) return false;
  if (!Letter::InClass(text.at(0))) return false;
  if (!AllInClass<Alphanumeric>(text.substr(1))) return false;
  return true;
}